

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  int i;
  long lVar4;
  vector<int,_std::allocator<int>_> file_label;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  string local_d0;
  string local_b0;
  FileList files;
  
  if (argc == 3) {
    std::__cxx11::string::string((string *)&local_b0,argv[1],(allocator *)&file_name);
    std::__cxx11::string::string((string *)&local_d0,argv[2],(allocator *)&file_label);
    flst::FileList::FileList(&files,&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    file_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    file_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    file_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    file_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    file_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    file_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    flst::FileList::nextBatch(&files,&file_name,&file_label,0x40);
    lVar3 = 0;
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"label:");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,file_label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar4]);
      poVar2 = std::operator<<(poVar2,"\tfile_name:");
      poVar2 = std::operator<<(poVar2,(string *)
                                      ((long)&((file_name.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar3));
      std::endl<char,std::char_traits<char>>(poVar2);
      lVar3 = lVar3 + 0x20;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&file_label.super__Vector_base<int,_std::allocator<int>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&file_name);
    flst::FileList::~FileList(&files);
    iVar1 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Useage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2,"file_dir file_type[eg: .jpg]");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    if(argc != 3)
    {
        std::cerr << "Useage: " << argv[0] << "file_dir file_type[eg: .jpg]" << std::endl;
        return -1;
    }
    flst::FileList files(argv[1], argv[2]);
    std::vector<std::string> file_name;
    std::vector<int> file_label;
    int batches = 64;

    files.nextBatch(file_name, file_label, batches);

    for(int i = 0; i < batches; i++)
    {
        std::cout << "label:" << file_label[i] << "\tfile_name:" << file_name[i] << std::endl;
    }

    return 0;
}